

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferMAXSizeValidation.cpp
# Opt level: O0

void __thiscall glcts::TextureBufferMAXSizeValidation::deinit(TextureBufferMAXSizeValidation *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TextureBufferMAXSizeValidation *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x1680))(0);
  (**(code **)(lVar3 + 0x40))(0x8892,0);
  (**(code **)(lVar3 + 0x40))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0);
  (**(code **)(lVar3 + 0xb8))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0);
  (**(code **)(lVar3 + 0x48))(0x90d2,0);
  if (this->m_cs_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_cs_id);
    this->m_cs_id = 0;
  }
  if (this->m_po_id != 0) {
    (**(code **)(lVar3 + 0x448))(this->m_po_id);
    this->m_po_id = 0;
  }
  if (this->m_ssbo_id != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_ssbo_id);
    this->m_ssbo_id = 0;
  }
  if (this->m_tbo_id != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_tbo_id);
    this->m_tbo_id = 0;
  }
  if (this->m_tbo_tex_id != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_tbo_tex_id);
    this->m_tbo_tex_id = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureBufferMAXSizeValidation::deinit(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES state */
	gl.useProgram(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, 0);
	gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, 0);
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, 0);

	/* Delete GLES objects */
	if (0 != m_cs_id)
	{
		gl.deleteShader(m_cs_id);
		m_cs_id = 0;
	}

	if (0 != m_po_id)
	{
		gl.deleteProgram(m_po_id);
		m_po_id = 0;
	}

	if (0 != m_ssbo_id)
	{
		gl.deleteBuffers(1, &m_ssbo_id);
		m_ssbo_id = 0;
	}

	if (0 != m_tbo_id)
	{
		gl.deleteBuffers(1, &m_tbo_id);
		m_tbo_id = 0;
	}

	if (0 != m_tbo_tex_id)
	{
		gl.deleteTextures(1, &m_tbo_tex_id);
		m_tbo_tex_id = 0;
	}

	/* Deinitialize base class */
	TestCaseBase::deinit();
}